

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O1

BinOpr subexpr(LexState *ls,expdesc *v,int limit)

{
  unsigned_short *puVar1;
  bool bVar2;
  int iVar3;
  BinOpr BVar4;
  ushort uVar5;
  UnOpr op;
  BinOpr op_00;
  expdesc v2;
  expdesc local_48;
  
  uVar5 = ls->L->nCcalls + 1;
  ls->L->nCcalls = uVar5;
  if (200 < uVar5) {
    errorlimit(ls->fs,200,"C levels");
  }
  iVar3 = (ls->t).token;
  if (iVar3 < 0x7e) {
    if (iVar3 == 0x23) {
      op = OPR_LEN;
      goto LAB_0011360d;
    }
    if (iVar3 == 0x2d) {
      bVar2 = false;
      op = OPR_MINUS;
    }
    else {
LAB_001135f5:
      op = OPR_NOUNOPR;
      bVar2 = true;
    }
  }
  else {
    if (iVar3 == 0x7e) {
      op = OPR_BNOT;
    }
    else {
      if (iVar3 != 0x10f) goto LAB_001135f5;
      op = OPR_NOT;
    }
LAB_0011360d:
    bVar2 = false;
  }
  if (!bVar2) {
    iVar3 = ls->linenumber;
    luaX_next(ls);
    subexpr(ls,v,0xc);
    luaK_prefix(ls->fs,op,v,iVar3);
    goto LAB_001137f5;
  }
  if (iVar3 < 0x114) {
    if (iVar3 < 0x109) {
      if (iVar3 == 0x7b) {
        constructor(ls,v);
      }
      else {
        if (iVar3 == 0x107) {
          v->t = -1;
          v->f = -1;
          v->k = VFALSE;
LAB_001137c2:
          (v->u).info = 0;
          goto LAB_001137ed;
        }
LAB_001138d1:
        suffixedexp(ls,v);
      }
    }
    else {
      if (iVar3 != 0x109) {
        if (iVar3 == 0x10e) {
          v->t = -1;
          v->f = -1;
          v->k = VNIL;
          goto LAB_001137c2;
        }
        goto LAB_001138d1;
      }
      luaX_next(ls);
      body(ls,v,0,ls->linenumber);
    }
  }
  else {
    if (iVar3 < 0x122) {
      if (iVar3 == 0x114) {
        v->t = -1;
        v->f = -1;
        v->k = VTRUE;
        goto LAB_001137c2;
      }
      if (iVar3 != 0x119) goto LAB_001138d1;
      if (ls->fs->f->is_vararg == '\0') {
        luaX_syntaxerror(ls,"cannot use \'...\' outside a vararg function");
      }
      iVar3 = luaK_codeABC(ls->fs,OP_VARARG,0,1,0);
      v->t = -1;
      v->f = -1;
      v->k = VVARARG;
LAB_001137aa:
      (v->u).info = iVar3;
    }
    else {
      if (iVar3 == 0x125) {
        iVar3 = luaK_stringK(ls->fs,(ls->t).seminfo.ts);
        v->t = -1;
        v->f = -1;
        v->k = VK;
        goto LAB_001137aa;
      }
      if (iVar3 == 0x123) {
        v->t = -1;
        v->f = -1;
        v->k = VKINT;
        (v->u).info = 0;
        v->u = *(anon_union_8_4_e6d17769_for_u *)&(ls->t).seminfo;
      }
      else {
        if (iVar3 != 0x122) goto LAB_001138d1;
        v->t = -1;
        v->f = -1;
        v->k = VKFLT;
        (v->u).info = 0;
        v->u = *(anon_union_8_4_e6d17769_for_u *)&(ls->t).seminfo;
      }
    }
LAB_001137ed:
    luaX_next(ls);
  }
LAB_001137f5:
  iVar3 = (ls->t).token;
  if (iVar3 < 0x7e) {
    if (iVar3 < 0x3c) {
      switch(iVar3) {
      case 0x25:
        op_00 = OPR_MOD;
        break;
      case 0x26:
        op_00 = OPR_BAND;
        break;
      default:
        goto switchD_0011381c_caseD_27;
      case 0x2a:
        op_00 = OPR_MUL;
        break;
      case 0x2b:
        bVar2 = false;
        op_00 = OPR_ADD;
        goto LAB_00113945;
      case 0x2d:
        op_00 = OPR_SUB;
        break;
      case 0x2f:
        op_00 = OPR_DIV;
      }
    }
    else if (iVar3 < 0x5e) {
      if (iVar3 == 0x3c) {
        op_00 = OPR_LT;
      }
      else {
        if (iVar3 != 0x3e) goto switchD_0011381c_caseD_27;
        op_00 = OPR_GT;
      }
    }
    else if (iVar3 == 0x5e) {
      op_00 = OPR_POW;
    }
    else {
      if (iVar3 != 0x7c) goto switchD_0011381c_caseD_27;
      op_00 = OPR_BOR;
    }
  }
  else {
    switch(iVar3) {
    case 0x110:
      op_00 = OPR_OR;
      break;
    case 0x111:
    case 0x112:
    case 0x113:
    case 0x114:
    case 0x115:
    case 0x116:
    case 0x119:
switchD_0011381c_caseD_27:
      op_00 = OPR_NOBINOPR;
      bVar2 = true;
      goto LAB_00113945;
    case 0x117:
      op_00 = OPR_IDIV;
      break;
    case 0x118:
      op_00 = OPR_CONCAT;
      break;
    case 0x11a:
      op_00 = OPR_EQ;
      break;
    case 0x11b:
      op_00 = OPR_GE;
      break;
    case 0x11c:
      op_00 = OPR_LE;
      break;
    case 0x11d:
      op_00 = OPR_NE;
      break;
    case 0x11e:
      op_00 = OPR_SHL;
      break;
    case 0x11f:
      op_00 = OPR_SHR;
      break;
    default:
      if (iVar3 == 0x7e) {
        op_00 = OPR_BXOR;
      }
      else {
        if (iVar3 != 0x101) goto switchD_0011381c_caseD_27;
        op_00 = OPR_AND;
      }
    }
  }
  bVar2 = false;
LAB_00113945:
  if (!bVar2) {
    do {
      if ((int)(uint)priority[op_00].left <= limit) break;
      iVar3 = ls->linenumber;
      luaX_next(ls);
      luaK_infix(ls->fs,op_00,v);
      BVar4 = subexpr(ls,&local_48,(uint)priority[op_00].right);
      luaK_posfix(ls->fs,op_00,v,&local_48,iVar3);
      op_00 = BVar4;
    } while (BVar4 != OPR_NOBINOPR);
  }
  puVar1 = &ls->L->nCcalls;
  *puVar1 = *puVar1 - 1;
  return op_00;
}

Assistant:

static BinOpr subexpr(LexState *ls, expdesc *v, int limit) {
    BinOpr op;
    UnOpr uop;
    enterlevel(ls);
    uop = getunopr(ls->t.token);
    if (uop != OPR_NOUNOPR) {
        int line = ls->linenumber;
        luaX_next(ls);
        subexpr(ls, v, UNARY_PRIORITY);
        luaK_prefix(ls->fs, uop, v, line);
    } else simpleexp(ls, v);
    /* expand while operators have priorities higher than 'limit' */
    op = getbinopr(ls->t.token);
    while (op != OPR_NOBINOPR && priority[op].left > limit) {
        expdesc v2;
        BinOpr nextop;
        int line = ls->linenumber;
        luaX_next(ls);
        luaK_infix(ls->fs, op, v);
        /* read sub-expression with higher priority */
        nextop = subexpr(ls, &v2, priority[op].right);
        luaK_posfix(ls->fs, op, v, &v2, line);
        op = nextop;
    }
    leavelevel(ls);
    return op;  /* return first untreated operator */
}